

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

void printOption(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  int iVar1;
  TidyConfigCategory TVar2;
  int iVar3;
  ctmbstr ptVar4;
  size_t sVar5;
  char *__dest;
  char *sbuf;
  char *sbuf_00;
  char *sbuf_01;
  char *s;
  bool bVar6;
  char *pcVar7;
  char *pcVar8;
  char *pc3;
  char *pcVar9;
  char *pc1;
  char *pc2;
  TidyIterator local_40;
  char *local_38;
  
  TVar2 = tidyOptGetCategory(topt);
  if (TVar2 == TidyInternalCategory) {
    return;
  }
  s = d->name;
  if ((*s == '\0') && (*d->type == '\0')) {
    return;
  }
  if (d->haveVals == no) {
    __dest = "-";
LAB_00132a47:
    local_38 = (char *)0x0;
  }
  else {
    __dest = d->vals;
    if (__dest != (char *)0x0) goto LAB_00132a47;
    local_40 = tidyOptGetPickList(topt);
    if (local_40 == (TidyIterator)0x0) {
      sVar5 = 1;
    }
    else {
      bVar6 = false;
      iVar3 = 0;
      do {
        iVar1 = iVar3 + 2;
        if (!bVar6) {
          iVar1 = iVar3;
        }
        ptVar4 = tidyOptGetNextPick(topt,&local_40);
        sVar5 = strlen(ptVar4);
        iVar3 = (int)sVar5 + iVar1;
        bVar6 = true;
      } while (local_40 != (TidyIterator)0x0);
      sVar5 = (size_t)(iVar3 + 1);
    }
    __dest = (char *)malloc(sVar5);
    if (__dest == (char *)0x0) goto LAB_00132bde;
    *__dest = '\0';
    local_40 = tidyOptGetPickList(topt);
    if (local_40 != (TidyIterator)0x0) {
      ptVar4 = tidyOptGetNextPick(topt,&local_40);
      strcat(__dest,ptVar4);
      if (local_40 != (TidyIterator)0x0) {
        do {
          sVar5 = strlen(__dest);
          (__dest + sVar5)[0] = ',';
          (__dest + sVar5)[1] = ' ';
          __dest[sVar5 + 2] = '\0';
          ptVar4 = tidyOptGetNextPick(topt,&local_40);
          strcat(__dest,ptVar4);
        } while (local_40 != (TidyIterator)0x0);
      }
    }
    s = d->name;
    local_38 = __dest;
  }
  ptVar4 = d->type;
  sbuf = (char *)malloc(0x1c);
  sbuf_00 = (char *)malloc(10);
  sbuf_01 = (char *)malloc(0x29);
  if (((sbuf != (char *)0x0) && (sbuf_00 != (char *)0x0)) && (sbuf_01 != (char *)0x0)) {
    do {
      s = cutToWhiteSpace(s,0x1b,sbuf);
      ptVar4 = cutToWhiteSpace(ptVar4,9,sbuf_00);
      __dest = cutToWhiteSpace(__dest,0x28,sbuf_01);
      pcVar9 = sbuf;
      if (*sbuf == '\0') {
        pcVar9 = "";
      }
      pcVar8 = sbuf_00;
      if (*sbuf_00 == '\0') {
        pcVar8 = "";
      }
      pcVar7 = sbuf_01;
      if (*sbuf_01 == '\0') {
        pcVar7 = "";
      }
      printf("%-27.27s %-9.9s  %-40.40s\n",pcVar9,pcVar8,pcVar7);
    } while (((s != (char *)0x0) || (ptVar4 != (char *)0x0)) || (__dest != (char *)0x0));
    free(sbuf);
    free(sbuf_00);
    free(sbuf_01);
    if (local_38 != (char *)0x0) {
      free(local_38);
    }
    return;
  }
LAB_00132bde:
  outOfMemory();
}

Assistant:

static void printOption(TidyDoc ARG_UNUSED(tdoc), /**< The Tidy document. */
                        TidyOption topt,          /**< The option to print. */
                        OptionDesc *d             /**< A pointer to the OptionDesc array. */
                        )
{
    if (tidyOptGetCategory( topt ) == TidyInternalCategory )
        return;

    if ( *d->name || *d->type )
    {
        ctmbstr pval = d->vals;
        tmbstr val = NULL;
        if (!d->haveVals)
        {
            pval = "-";
        }
        else if (pval == NULL)
        {
            val = GetAllowedValues( topt, d);
            pval = val;
        }
        print3Columns( fmt, 27, 9, 40, d->name, d->type, pval );
        if (val)
            free(val);
    }
}